

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O0

string * cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                   (string *__return_storage_ptr__,
                   vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *r,char *delimiter)

{
  bool bVar1;
  reference pcVar2;
  undefined1 local_1e8 [32];
  ostream_iterator<cmLinkImplItem,_char,_std::char_traits<char>_> local_1c8;
  cmLinkImplItem *local_1b8;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_1b0;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_1a8;
  InputIt last;
  InputIt first;
  ostringstream os;
  char *delimiter_local;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *r_local;
  
  bVar1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::empty(r);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&first);
    last._M_current =
         (cmLinkImplItem *)std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(r);
    local_1a8._M_current =
         (cmLinkImplItem *)std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(r);
    __gnu_cxx::
    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator--(&local_1a8);
    local_1b0._M_current = last._M_current;
    local_1b8 = local_1a8._M_current;
    std::ostream_iterator<cmLinkImplItem,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_1c8,(ostream_type *)&first,delimiter);
    std::
    copy<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,std::ostream_iterator<cmLinkImplItem,char,std::char_traits<char>>>
              ((cmLinkImplItem *)local_1e8,local_1b0,
               (ostream_iterator<cmLinkImplItem,_char,_std::char_traits<char>_> *)local_1b8);
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&local_1a8);
    std::operator<<((ostream *)&first,(string *)pcVar2);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&first);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& r, const char* delimiter)
{
  if (r.empty())
    {
    return std::string();
    }
  std::ostringstream os;
  typedef typename Range::value_type ValueType;
  typedef typename Range::const_iterator InputIt;
  const InputIt first = r.begin();
  InputIt last = r.end();
  --last;
  std::copy(first, last,
      std::ostream_iterator<ValueType>(os, delimiter));

  os << *last;

  return os.str();
}